

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_medium.h
# Opt level: O3

bool __thiscall constant_medium::hit(constant_medium *this,ray *r,interval ray_t,hit_record *rec)

{
  double dVar1;
  double dVar2;
  element_type *peVar3;
  undefined1 auVar4 [16];
  int iVar5;
  bool bVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  double dVar9;
  double dVar10;
  hit_record rec2;
  hit_record rec1;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  double local_98;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  double local_38;
  
  local_48 = 0;
  p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_a8 = 0;
  p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  iVar5 = (*((this->boundary).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_hittable[2])(SUB84(interval::universe.min,0),interval::universe.max);
  if ((char)iVar5 != '\0') {
    peVar3 = (this->boundary).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar5 = (*peVar3->_vptr_hittable[2])
                      (SUB84(local_38 + 0.0001,0),0x7ff0000000000000,peVar3,r,&local_d8);
    if ((char)iVar5 != '\0') {
      uVar7 = SUB84(local_38,0);
      uVar8 = (undefined4)((ulong)local_38 >> 0x20);
      if (local_38 < ray_t.min) {
        uVar7 = ray_t.min._0_4_;
        uVar8 = ray_t.min._4_4_;
        local_38 = ray_t.min;
      }
      if (ray_t.max < local_98) {
        local_98 = ray_t.max;
      }
      if ((double)CONCAT44(uVar8,uVar7) < local_98) {
        if ((double)CONCAT44(uVar8,uVar7) <= 0.0 && (double)CONCAT44(uVar8,uVar7) != 0.0) {
          local_38 = 0.0;
          uVar7 = 0;
          uVar8 = 0;
        }
        dVar1 = (r->dir).e[0];
        dVar2 = (r->dir).e[1];
        dVar9 = (r->dir).e[2];
        dVar9 = SQRT(dVar9 * dVar9 + dVar1 * dVar1 + dVar2 * dVar2);
        dVar10 = local_98 - (double)CONCAT44(uVar8,uVar7);
        dVar1 = this->neg_inv_density;
        iVar5 = rand();
        dVar2 = log((double)iVar5 * 4.656612873077393e-10);
        dVar2 = dVar2 * dVar1;
        if (dVar2 <= dVar10 * dVar9) {
          dVar9 = dVar2 / dVar9 + local_38;
          rec->t = dVar9;
          dVar1 = (r->dir).e[2];
          dVar2 = (r->orig).e[2];
          dVar10 = dVar9 * (r->dir).e[1] + (r->orig).e[1];
          auVar4._8_4_ = SUB84(dVar10,0);
          auVar4._0_8_ = dVar9 * (r->dir).e[0] + (r->orig).e[0];
          auVar4._12_4_ = (int)((ulong)dVar10 >> 0x20);
          *(undefined1 (*) [16])(rec->p).e = auVar4;
          (rec->p).e[2] = dVar1 * dVar9 + dVar2;
          (rec->normal).e[0] = 1.0;
          (rec->normal).e[1] = 0.0;
          (rec->normal).e[2] = 0.0;
          rec->front_face = true;
          (rec->mat).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (this->phase_function).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(rec->mat).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     &(this->phase_function).
                      super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          bVar6 = true;
          goto LAB_0011f592;
        }
      }
    }
  }
  bVar6 = false;
LAB_0011f592:
  if (p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
  }
  if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
  }
  return bVar6;
}

Assistant:

bool hit(const ray& r, interval ray_t, hit_record& rec) const override {
        hit_record rec1, rec2;

        if (!boundary->hit(r, interval::universe, rec1))
            return false;

        if (!boundary->hit(r, interval(rec1.t+0.0001, infinity), rec2))
            return false;

        if (rec1.t < ray_t.min) rec1.t = ray_t.min;
        if (rec2.t > ray_t.max) rec2.t = ray_t.max;

        if (rec1.t >= rec2.t)
            return false;

        if (rec1.t < 0)
            rec1.t = 0;

        auto ray_length = r.direction().length();
        auto distance_inside_boundary = (rec2.t - rec1.t) * ray_length;
        auto hit_distance = neg_inv_density * std::log(random_double());

        if (hit_distance > distance_inside_boundary)
            return false;

        rec.t = rec1.t + hit_distance / ray_length;
        rec.p = r.at(rec.t);

        rec.normal = vec3(1,0,0);  // arbitrary
        rec.front_face = true;     // also arbitrary
        rec.mat = phase_function;

        return true;
    }